

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall adios2sys::CommandLineArguments::CommandLineArguments(CommandLineArguments *this)

{
  CommandLineArgumentsInternal *this_00;
  
  (this->Help)._M_dataplus._M_p = (pointer)&(this->Help).field_2;
  (this->Help)._M_string_length = 0;
  (this->Help).field_2._M_local_buf[0] = '\0';
  this_00 = (CommandLineArgumentsInternal *)operator_new(0x98);
  CommandLineArgumentsInternal::CommandLineArgumentsInternal(this_00);
  this->Internals = this_00;
  std::__cxx11::string::assign((char *)&this->Help);
  this->LineLength = 0x50;
  this->StoreUnusedArgumentsFlag = false;
  return;
}

Assistant:

CommandLineArguments::CommandLineArguments()
{
  this->Internals = new CommandLineArguments::Internal;
  this->Help = "";
  this->LineLength = 80;
  this->StoreUnusedArgumentsFlag = false;
}